

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcmalloc_unittest.cc
# Opt level: O0

void TestAlignmentForSize(int size)

{
  ulong uVar1;
  TestingPortal *pTVar2;
  void *pvVar3;
  int local_34c;
  int i_1;
  uintptr_t p;
  int i;
  void *ptrs [100];
  size_t min_align;
  int size_local;
  
  pTVar2 = tcmalloc::TestingPortal::Get();
  ptrs[99] = (void *)(**(code **)(*(long *)pTVar2 + 0x18))();
  printf("Testing alignment of malloc(%d)\n",(ulong)(uint)size);
  p._4_4_ = 0;
  while( true ) {
    if (99 < p._4_4_) {
      for (local_34c = 0; local_34c < 100; local_34c = local_34c + 1) {
        free(*(void **)(&stack0xfffffffffffffcc8 + (long)local_34c * 8));
      }
      return;
    }
    pvVar3 = malloc((long)size);
    *(void **)(&stack0xfffffffffffffcc8 + (long)p._4_4_ * 8) = pvVar3;
    uVar1 = *(ulong *)(&stack0xfffffffffffffcc8 + (long)p._4_4_ * 8);
    if ((uVar1 & 7) != 0) {
      syscall(1,2,"Check failed: (p % sizeof(void*)) == 0\n",0x27);
      abort();
    }
    if ((uVar1 & 7) != 0) {
      syscall(1,2,"Check failed: (p % sizeof(double)) == 0\n",0x28);
      abort();
    }
    if ((ptrs[99] <= (void *)(long)size) && (uVar1 % (ulong)ptrs[99] != 0)) break;
    p._4_4_ = p._4_4_ + 1;
  }
  syscall(1,2,"Check failed: (p % min_align) == 0\n",0x23);
  abort();
}

Assistant:

static void TestAlignmentForSize(int size) {
  const size_t min_align = TestingPortal::Get()->GetMinAlign();

  printf("Testing alignment of malloc(%d)\n", size);
  static const int kNum = 100;
  void* ptrs[kNum];
  for (int i = 0; i < kNum; i++) {
    ptrs[i] = malloc(size);
    uintptr_t p = reinterpret_cast<uintptr_t>(ptrs[i]);
    CHECK((p % sizeof(void*)) == 0);
    CHECK((p % sizeof(double)) == 0);

    // Must have 16-byte (or 8-byte in case of -DTCMALLOC_ALIGN_8BYTES)
    // alignment for large enough objects
    if (size >= min_align) {
      CHECK((p % min_align) == 0);
    }
  }
  for (int i = 0; i < kNum; i++) {
    free(ptrs[i]);
  }
}